

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

void dofiretrap(obj *box)

{
  byte bVar1;
  boolean bVar2;
  uint uVar3;
  char *str;
  int tmp;
  int iVar4;
  int iVar5;
  char *pcVar6;
  bool give_feedback;
  
  if ((u.uprops[0x1e].intrinsic != 0) ||
     (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
      (give_feedback = true, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
    if (ublindf == (obj *)0x0) {
      give_feedback = false;
    }
    else {
      give_feedback = ublindf->oartifact == '\x1d';
    }
  }
  if ((box == (obj *)0x0) || (box->where == '\x03')) {
    bVar1 = u._1052_1_ & 2;
  }
  else {
    bVar1 = is_pool(level,(int)box->ox,(int)box->oy);
  }
  if (bVar1 == 0) {
    pcVar6 = "bursts";
    if (box == (obj *)0x0) {
      pcVar6 = "erupts";
      str = surface((int)u.ux,(int)u.uy);
    }
    else {
      str = xname(box);
    }
    the(str);
    pline("A %s %s from %s!","tower of flame",pcVar6);
    iVar4 = 2;
    iVar5 = -2;
    do {
      uVar3 = mt_random();
      iVar4 = iVar4 + (uVar3 & 3);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0);
    fire_damageu(iVar4,(monst *)0x0,"tower of flame",0,0x14,'\x01','\x01');
    if ((box == (obj *)0x0) &&
       (iVar4 = burn_floor_paper((int)u.ux,(int)u.uy,give_feedback,'\x01'),
       give_feedback == false && iVar4 != 0)) {
      pline("You smell paper burning.");
    }
    bVar2 = is_ice(level,(int)u.ux,(int)u.uy);
    if (bVar2 != '\0') {
      melt_ice(u.ux,u.uy);
      return;
    }
  }
  else {
    if (box == (obj *)0x0) {
      pcVar6 = surface((int)u.ux,(int)u.uy);
    }
    else {
      pcVar6 = xname(box);
    }
    pcVar6 = the(pcVar6);
    pline("A cascade of steamy bubbles erupts from %s!",pcVar6);
    if ((u.uprops[1].extrinsic == 0 && u.uprops[1].intrinsic == 0) &&
       (((byte)youmonst.mintrinsics & 1) == 0)) {
      uVar3 = mt_random();
      losehp(uVar3 % 3 + 1,"boiling water",1);
      return;
    }
  }
  return;
}

Assistant:

static void dofiretrap(struct obj *box)
{
	boolean see_it = !Blind;

/* Bug: for box case, the equivalent of burn_floor_paper() ought
 * to be done upon its contents.
 */

	if ((box && !carried(box)) ? is_pool(level, box->ox, box->oy) : Underwater) {
	    pline("A cascade of steamy bubbles erupts from %s!",
		    the(box ? xname(box) : surface(u.ux,u.uy)));
	    if (!Fire_resistance)
		losehp(rnd(3), "boiling water", KILLED_BY);
	    return;
	}
	pline("A %s %s from %s!", tower_of_flame,
	      box ? "bursts" : "erupts",
	      the(box ? xname(box) : surface(u.ux,u.uy)));
	fire_damageu(dice(2, 4), NULL, tower_of_flame, KILLED_BY_AN, 20, TRUE, TRUE);
	if (!box && burn_floor_paper(u.ux, u.uy, see_it, TRUE) && !see_it)
	    pline("You smell paper burning.");
	if (is_ice(level, u.ux, u.uy))
	    melt_ice(u.ux, u.uy);
}